

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

int xmlConvertSGMLCatalog(xmlCatalogPtr catal)

{
  xmlGenericErrorFunc p_Var1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  xmlCatalogPtr local_18;
  xmlCatalogPtr catal_local;
  
  if ((catal == (xmlCatalogPtr)0x0) || (catal->type != XML_SGML_CATALOG_TYPE)) {
    catal_local._4_4_ = -1;
  }
  else {
    local_18 = catal;
    if (xmlDebugCatalogs != 0) {
      pp_Var2 = __xmlGenericError();
      p_Var1 = *pp_Var2;
      ppvVar3 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar3,"Converting SGML catalog to XML\n");
    }
    xmlHashScan(local_18->sgml,xmlCatalogConvertEntry,&local_18);
    catal_local._4_4_ = 0;
  }
  return catal_local._4_4_;
}

Assistant:

int
xmlConvertSGMLCatalog(xmlCatalogPtr catal) {

    if ((catal == NULL) || (catal->type != XML_SGML_CATALOG_TYPE))
	return(-1);

    if (xmlDebugCatalogs) {
	xmlGenericError(xmlGenericErrorContext,
		"Converting SGML catalog to XML\n");
    }
    xmlHashScan(catal->sgml, xmlCatalogConvertEntry, &catal);
    return(0);
}